

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

string * __thiscall
pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,wchar_t *str,size_t length)

{
  uint uVar1;
  wchar_t *pwVar2;
  long lVar3;
  
  if (str == (wchar_t *)0x0) {
    lVar3 = 0;
  }
  else {
    pwVar2 = (wchar_t *)0x0;
    lVar3 = 0;
    do {
      uVar1 = *(uint *)(this + (long)pwVar2 * 4);
      length = 4;
      if ((uVar1 < 0x10000) && (length = 1, 0x7f < uVar1)) {
        length = 3 - (ulong)(uVar1 < 0x800);
      }
      lVar3 = lVar3 + length;
      pwVar2 = (wchar_t *)((long)pwVar2 + 1);
    } while (str != pwVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar3);
  if (lVar3 != 0) {
    anon_unknown_0::as_utf8_end((__return_storage_ptr__->_M_dataplus)._M_p,(size_t)this,str,length);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}